

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.c
# Opt level: O0

void yaml_emitter_delete(yaml_emitter_t *emitter)

{
  yaml_event_t *event;
  yaml_tag_directive_t *pyVar1;
  yaml_char_t *ptr;
  yaml_tag_directive_t tag_directive;
  yaml_emitter_t *emitter_local;
  
  if (emitter != (yaml_emitter_t *)0x0) {
    yaml_free((emitter->buffer).start);
    (emitter->buffer).end = (yaml_char_t *)0x0;
    (emitter->buffer).pointer = (yaml_char_t *)0x0;
    (emitter->buffer).start = (yaml_char_t *)0x0;
    yaml_free((emitter->raw_buffer).start);
    (emitter->raw_buffer).end = (uchar *)0x0;
    (emitter->raw_buffer).pointer = (uchar *)0x0;
    (emitter->raw_buffer).start = (uchar *)0x0;
    yaml_free((emitter->states).start);
    (emitter->states).end = (yaml_emitter_state_t *)0x0;
    (emitter->states).top = (yaml_emitter_state_t *)0x0;
    (emitter->states).start = (yaml_emitter_state_t *)0x0;
    while ((emitter->events).head != (emitter->events).tail) {
      event = (emitter->events).head;
      (emitter->events).head = event + 1;
      yaml_event_delete(event);
    }
    yaml_free((emitter->events).start);
    (emitter->events).end = (yaml_event_t *)0x0;
    (emitter->events).tail = (yaml_event_t *)0x0;
    (emitter->events).head = (yaml_event_t *)0x0;
    (emitter->events).start = (yaml_event_t *)0x0;
    yaml_free((emitter->indents).start);
    (emitter->indents).end = (int *)0x0;
    (emitter->indents).top = (int *)0x0;
    (emitter->indents).start = (int *)0x0;
    while ((emitter->tag_directives).start != (emitter->tag_directives).top) {
      pyVar1 = (emitter->tag_directives).top;
      (emitter->tag_directives).top = pyVar1 + -1;
      ptr = pyVar1[-1].prefix;
      yaml_free(pyVar1[-1].handle);
      yaml_free(ptr);
    }
    yaml_free((emitter->tag_directives).start);
    (emitter->tag_directives).end = (yaml_tag_directive_t *)0x0;
    (emitter->tag_directives).top = (yaml_tag_directive_t *)0x0;
    (emitter->tag_directives).start = (yaml_tag_directive_t *)0x0;
    yaml_free(emitter->anchors);
    memset(emitter,0,0x1b0);
    return;
  }
  __assert_fail("emitter",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dyna-dot[P]libyaml/src/api.c"
                ,0x18a,"void yaml_emitter_delete(yaml_emitter_t *)");
}

Assistant:

YAML_DECLARE(void)
yaml_emitter_delete(yaml_emitter_t *emitter)
{
    assert(emitter);    /* Non-NULL emitter object expected. */

    BUFFER_DEL(emitter, emitter->buffer);
    BUFFER_DEL(emitter, emitter->raw_buffer);
    STACK_DEL(emitter, emitter->states);
    while (!QUEUE_EMPTY(emitter, emitter->events)) {
        yaml_event_delete(&DEQUEUE(emitter, emitter->events));
    }
    QUEUE_DEL(emitter, emitter->events);
    STACK_DEL(emitter, emitter->indents);
    while (!STACK_EMPTY(empty, emitter->tag_directives)) {
        yaml_tag_directive_t tag_directive = POP(emitter, emitter->tag_directives);
        yaml_free(tag_directive.handle);
        yaml_free(tag_directive.prefix);
    }
    STACK_DEL(emitter, emitter->tag_directives);
    yaml_free(emitter->anchors);

    memset(emitter, 0, sizeof(yaml_emitter_t));
}